

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void expr_toreg(FuncState *fs,ExpDesc *e,BCReg reg)

{
  int iVar1;
  BCReg in_EDX;
  FuncState *in_RSI;
  FuncState *in_RDI;
  BCPos jval;
  BCPos jtrue;
  BCPos jfalse;
  BCPos jend;
  BCPos local_28;
  BCPos dtarget;
  BCPos in_stack_ffffffffffffffe4;
  BCPos list;
  undefined4 in_stack_ffffffffffffffe8;
  BCPos vtarget;
  
  expr_toreg_nobranch(in_RDI,(ExpDesc *)in_RSI,in_EDX);
  if (*(int *)&in_RSI->ls == 10) {
    jmp_append(in_RSI,(BCPos *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4)
    ;
  }
  if (*(int *)((long)&in_RSI->ls + 4) == *(int *)&in_RSI->L) goto LAB_001532b9;
  list = 0xffffffff;
  dtarget = 0xffffffff;
  iVar1 = jmp_novalue((FuncState *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0xffffffff);
  if (iVar1 == 0) {
    iVar1 = jmp_novalue((FuncState *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),list);
    if (iVar1 != 0) goto LAB_001531d2;
  }
  else {
LAB_001531d2:
    if (*(int *)&in_RSI->ls == 10) {
      local_28 = 0xffffffff;
    }
    else {
      local_28 = bcemit_jmp((FuncState *)CONCAT44(list,dtarget));
    }
    list = bcemit_INS(in_RSI,in_EDX);
    bcemit_INS(in_RSI,in_EDX);
    dtarget = bcemit_INS(in_RSI,in_EDX);
    jmp_tohere((FuncState *)CONCAT44(list,dtarget),local_28);
  }
  vtarget = in_RDI->pc;
  in_RDI->lasttarget = vtarget;
  jmp_patchval(in_RSI,in_EDX,vtarget,list,dtarget);
  jmp_patchval(in_RSI,in_EDX,vtarget,list,dtarget);
LAB_001532b9:
  *(undefined4 *)((long)&in_RSI->ls + 4) = 0xffffffff;
  *(undefined4 *)&in_RSI->L = 0xffffffff;
  *(BCReg *)&in_RSI->kt = in_EDX;
  *(undefined4 *)&in_RSI->ls = 0xc;
  return;
}

Assistant:

static void expr_toreg(FuncState *fs, ExpDesc *e, BCReg reg)
{
  expr_toreg_nobranch(fs, e, reg);
  if (e->k == VJMP)
    jmp_append(fs, &e->t, e->u.s.info);  /* Add it to the true jump list. */
  if (expr_hasjump(e)) {  /* Discharge expression with branches. */
    BCPos jend, jfalse = NO_JMP, jtrue = NO_JMP;
    if (jmp_novalue(fs, e->t) || jmp_novalue(fs, e->f)) {
      BCPos jval = (e->k == VJMP) ? NO_JMP : bcemit_jmp(fs);
      jfalse = bcemit_AD(fs, BC_KPRI, reg, VKFALSE);
      bcemit_AJ(fs, BC_JMP, fs->freereg, 1);
      jtrue = bcemit_AD(fs, BC_KPRI, reg, VKTRUE);
      jmp_tohere(fs, jval);
    }
    jend = fs->pc;
    fs->lasttarget = jend;
    jmp_patchval(fs, e->f, jend, reg, jfalse);
    jmp_patchval(fs, e->t, jend, reg, jtrue);
  }
  e->f = e->t = NO_JMP;
  e->u.s.info = reg;
  e->k = VNONRELOC;
}